

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mspm.cpp
# Opt level: O2

void __thiscall pg::MSPMSolver::solve(MSPMSolver *this,int node,int str)

{
  int iVar1;
  Game *pGVar2;
  uint uVar3;
  ostream *poVar4;
  Error *this_00;
  int iVar5;
  int *piVar6;
  int iVar7;
  long lVar8;
  int *piVar9;
  int i;
  uint winner;
  bool bVar10;
  int from;
  int node_local;
  queue<int,_std::deque<int,_std::allocator<int>_>_> q;
  
  bVar10 = this->pms[(long)this->k * (long)node] != -1;
  node_local = node;
  if ((this->pms + (long)this->k * (long)node)[bVar10] != -1) {
    this_00 = (Error *)__cxa_allocate_exception(0x40);
    Error::Error(this_00,"logic error",
                 "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]oink/src/solvers/mspm.cpp"
                 ,0xef);
    __cxa_throw(this_00,&Error::typeinfo,Error::~Error);
  }
  if ((this->super_Solver).trace != 0) {
    poVar4 = std::operator<<((this->super_Solver).logger,"Detected \x1b[1;31mTop\x1b[m from ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,node);
    poVar4 = std::operator<<(poVar4,"/");
    poVar4 = (ostream *)
             std::ostream::operator<<(poVar4,((this->super_Solver).game)->_priority[node]);
    poVar4 = std::operator<<(poVar4," to ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,str);
    poVar4 = std::operator<<(poVar4,"/");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,((this->super_Solver).game)->_priority[str])
    ;
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  std::queue<int,std::deque<int,std::allocator<int>>>::
  queue<std::deque<int,std::allocator<int>>,void>(&q);
  iVar7 = node_local;
  uVar3 = Solver::owner(&this->super_Solver,node_local);
  winner = (uint)bVar10;
  if (uVar3 != winner) {
    str = -1;
  }
  Solver::solve(&this->super_Solver,iVar7,winner,str);
  this->cover[node_local] = -1;
  std::deque<int,_std::allocator<int>_>::push_back(&q.c,&node_local);
  todo_push(this,node_local);
  do {
    if (q.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish.
        _M_cur == q.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
                  _M_start._M_cur) {
      iVar7 = this->coverdepth + 1;
      this->coverdepth = iVar7;
      coverlower(this,node_local,iVar7);
      if (0 < (this->super_Solver).trace) {
        poVar4 = std::operator<<((this->super_Solver).logger,"Cover status:");
        std::endl<char,std::char_traits<char>>(poVar4);
        for (lVar8 = 0; lVar8 < ((this->super_Solver).game)->n_vertices; lVar8 = lVar8 + 1) {
          if (this->cover[lVar8] != 0) {
            poVar4 = (ostream *)std::ostream::operator<<((this->super_Solver).logger,(int)lVar8);
            poVar4 = std::operator<<(poVar4,"/");
            poVar4 = (ostream *)
                     std::ostream::operator<<(poVar4,((this->super_Solver).game)->_priority[lVar8]);
            poVar4 = std::operator<<(poVar4,": ");
            poVar4 = (ostream *)std::ostream::operator<<(poVar4,this->cover[lVar8]);
            std::endl<char,std::char_traits<char>>(poVar4);
          }
        }
      }
      std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
                ((_Deque_base<int,_std::allocator<int>_> *)&q);
      return;
    }
    iVar7 = *q.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
             _M_start._M_cur;
    std::deque<int,_std::allocator<int>_>::pop_front(&q.c);
    pGVar2 = (this->super_Solver).game;
    piVar9 = pGVar2->_inedges + pGVar2->_firstins[iVar7];
    while( true ) {
      iVar1 = *piVar9;
      lVar8 = (long)iVar1;
      if (lVar8 == -1) break;
      from = iVar1;
      if ((this->cover[lVar8] == 0) &&
         (piVar6 = ((this->super_Solver).game)->_priority, piVar6[lVar8] <= piVar6[node_local])) {
        uVar3 = Solver::owner(&this->super_Solver,iVar1);
        iVar1 = from;
        if (uVar3 == winner) {
LAB_0015de32:
          uVar3 = Solver::owner(&this->super_Solver,from);
          iVar5 = -1;
          if (uVar3 == winner) {
            iVar5 = iVar7;
          }
          Solver::solve(&this->super_Solver,iVar1,winner,iVar5);
          this->cover[from] = -1;
          this->pms[(int)(from * this->k + winner)] = -1;
          std::deque<int,_std::allocator<int>_>::push_back(&q.c,&from);
          todo_push(this,from);
        }
        else {
          pGVar2 = (this->super_Solver).game;
          piVar6 = pGVar2->_outedges + pGVar2->_firstouts[from];
          do {
            iVar5 = *piVar6;
            if ((long)iVar5 == -1) goto LAB_0015de32;
            piVar6 = piVar6 + 1;
          } while (this->cover[iVar5] < 0);
        }
      }
      piVar9 = piVar9 + 1;
    }
  } while( true );
}

Assistant:

void
MSPMSolver::solve(int node, int str)
{
    int *pm = pms + k*node;
    const int pl = pm[0] == -1 ? 0 : 1;
    if (pm[pl] != -1) LOGIC_ERROR;

    if (trace) logger << "Detected \033[1;31mTop\033[m from " << node << "/" << priority(node) << " to " << str << "/" << priority(str) << std::endl;

    // initialize
    std::queue<int> q;

    // solve <node>
    Solver::solve(node, pl, owner(node) == pl ? str : -1);
    // if (pl == (priority(node)&1)) counts[priority(node)]--;
    cover[node] = -1;
    q.push(node);
    todo_push(node);

    // attract within uncovered area to <node> for <pl>
    while (!q.empty()) {
        int n = q.front();
        q.pop();
        for (auto curedge = ins(n); *curedge != -1; curedge++) {
            int from = *curedge;
            // logger << "trying edge " << from << "/" << priority(from) << " to " << n << std::endl;
            if (cover[from]) continue;
            if (priority(from) > priority(node)) continue;
            if (owner(from) != pl) {
                bool escapes = false;
                for (auto curedge = outs(from); *curedge != -1; curedge++) {
                    int to = *curedge;
                    if (cover[to] < 0) continue; // disabled or already solved
                    // if (cover[to] != 0) LOGIC_ERROR; // should have been covered
                    // ^--- it can escape, happens when alternating!
                    escapes = true;
                    break;
                }
                if (escapes) continue;
            }
            Solver::solve(from, pl, owner(from) == pl ? n : -1);
            // if (winner == (priority(from)&1)) counts[priority(from)]--;
            cover[from] = -1;
            pms[k*from+pl] = -1;
            q.push(from);
            todo_push(from);
        }
    }

    // after lifting, cover everything that is lower
    coverlower(node, ++coverdepth);

    if (trace >= 1) {
        logger << "Cover status:" << std::endl;
        for (int i=0; i<nodecount(); i++) {
            if (cover[i]) logger << i << "/" << priority(i) << ": " << cover[i] << std::endl;
        }
    }
}